

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icrs2cirs.cpp
# Opt level: O0

CEExecOptions * DefineOpts(void)

{
  CEExecOptions *in_RDI;
  CEExecOptions *in_stack_00000010;
  CEExecOptions *opts;
  string *this;
  CEExecOptions *__lhs;
  string *in_stack_ffffffffffffff58;
  CEExecOptions *in_stack_ffffffffffffff60;
  string local_88 [32];
  string local_68 [24];
  CEExecOptions *in_stack_ffffffffffffffb0;
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = 0;
  __lhs = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"icrs2cirs",&local_31);
  CEExecOptions::CEExecOptions(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  this = (string *)&stack0xffffffffffffff58;
  std::__cxx11::string::string(this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)in_RDI);
  CLOptions::AddProgramDescription(&in_RDI->super_CLOptions,(string *)this);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  CEExecOptions::AddIcrsPars(in_stack_00000010);
  CEExecOptions::AddJDPar(in_stack_ffffffffffffffb0);
  return __lhs;
}

Assistant:

CEExecOptions DefineOpts()
{
    CEExecOptions opts("icrs2cirs");

    // Add version and description
    opts.AddProgramDescription(std::string() +
        "Converts from ICRS (solar system barycentric) coordinates to CIRS " +
        "(Earth centric) coordinates for a given Julian date.");

    // Set the options
    opts.AddIcrsPars();
    opts.AddJDPar();
    
    return opts;
}